

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabin_karp.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *this;
  string local_a8 [32];
  string local_88 [39];
  allocator local_61;
  string local_60 [8];
  string target;
  allocator local_29;
  string local_28 [8];
  string source;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"sdsafsakobeasdsafsaf",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"kobe",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::string(local_88,local_28);
  std::__cxx11::string::string(local_a8,local_60);
  iVar1 = strStr((string *)local_88,(string *)local_a8);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int main()
{
    std::string source = "sdsafsakobeasdsafsaf";
    std::string target = "kobe";
    std::cout<<strStr(source,target)<<std::endl;
}